

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::BlockManager(BlockManager *this,SignalInterrupt *interrupt,Options opts)

{
  _Rb_tree_header *p_Var1;
  path *this_00;
  pointer *ppbVar2;
  byte *pbVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  path dir;
  path dir_00;
  char cVar8;
  FILE *pFVar9;
  long lVar10;
  runtime_error *this_01;
  size_t in_RCX;
  undefined8 *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  bool bVar11;
  Span<std::byte> output;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view logging_function;
  path *this_02;
  path *__p;
  void *pvVar12;
  undefined8 uVar13;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var14;
  path local_1a8;
  path local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  path local_118;
  path xor_key_path;
  AutoFile xor_key_file;
  array<std::byte,_8UL> xor_key;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex +
   0x10) = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__prev = (__pthread_internal_list *)0x0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__next = (__pthread_internal_list *)0x0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind
       = 1;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
  _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_payload =
       (_Storage<node::BlockfileCursor,_true>)0x0;
  *(undefined8 *)
   &(this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
    _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_engaged = 1;
  *(undefined8 *)
   ((long)&(this->m_blockfile_cursors)._M_elems[1].
           super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
           super__Optional_payload_base<node::BlockfileCursor>._M_payload + 4) = 0;
  this->m_check_for_pruning = false;
  this->m_prune_mode = in_RDX[2] != 0;
  xor_key._M_elems[0] = 0;
  xor_key._M_elems[1] = 0;
  xor_key._M_elems[2] = 0;
  xor_key._M_elems[3] = 0;
  xor_key._M_elems[4] = 0;
  xor_key._M_elems[5] = 0;
  xor_key._M_elems[6] = 0;
  xor_key._M_elems[7] = 0;
  if ((*(char *)(in_RDX + 1) == '\x01') &&
     (cVar8 = std::filesystem::is_empty((path *)(in_RDX + 4)), cVar8 != '\0')) {
    FastRandomContext::FastRandomContext((FastRandomContext *)&xor_key_file,false);
    output.m_size = 8;
    output.m_data = xor_key._M_elems;
    FastRandomContext::fillrand((FastRandomContext *)&xor_key_file,output);
    ChaCha20::~ChaCha20((ChaCha20 *)
                        &xor_key_file.m_xor.
                         super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish);
  }
  __p = (path *)(in_RDX + 4);
  std::filesystem::__cxx11::path::path(&local_118,__p);
  std::filesystem::__cxx11::path::_M_append(&local_118,7,"xor.dat");
  this_02 = &xor_key_path.super_path;
  std::filesystem::__cxx11::path::path(this_02,&local_118);
  std::filesystem::__cxx11::path::~path(&local_118);
  cVar8 = std::filesystem::status((path *)this_02);
  if ((cVar8 == '\0') || (cVar8 == -1)) {
    pFVar9 = fsbridge::fopen((char *)&xor_key_path,"wbx");
    pvVar12 = (void *)0x0;
    uVar13 = 0;
    _Var14._M_head_impl = (_Impl *)0x0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)__p;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this_02;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AutoFile::AutoFile(&xor_key_file,(FILE *)pFVar9,data_xor);
    if (pvVar12 != (void *)0x0) {
      operator_delete(pvVar12,(long)_Var14._M_head_impl - (long)pvVar12);
    }
    AutoFile::write(&xor_key_file,(int)&xor_key,&DAT_00000008,in_RCX);
  }
  else {
    pFVar9 = fsbridge::fopen((char *)&xor_key_path,"rb");
    pvVar12 = (void *)0x0;
    uVar13 = 0;
    _Var14._M_head_impl = (_Impl *)0x0;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)__p;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this_02;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AutoFile::AutoFile(&xor_key_file,(FILE *)pFVar9,data_xor_00);
    if (pvVar12 != (void *)0x0) {
      operator_delete(pvVar12,(long)_Var14._M_head_impl - (long)pvVar12);
    }
    AutoFile::read(&xor_key_file,(int)&xor_key,&DAT_00000008,in_RCX);
  }
  AutoFile::~AutoFile(&xor_key_file);
  if (*(char *)(in_RDX + 1) == '\0') {
    xor_key_file.m_file = (FILE *)0x0;
    lVar10 = 0;
    do {
      pbVar3 = xor_key._M_elems + lVar10;
      bVar4 = *(byte *)((long)&xor_key_file.m_file + lVar10);
      if (*pbVar3 != bVar4) break;
      bVar11 = lVar10 != 7;
      lVar10 = lVar10 + 1;
    } while (bVar11);
    if (*pbVar3 != bVar4) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      s_00.m_size = 8;
      s_00.m_data = xor_key._M_elems;
      HexStr_abi_cxx11_(&local_138,s_00);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,xor_key_path.super_path._M_pathname._M_dataplus._M_p,
                 xor_key_path.super_path._M_pathname._M_dataplus._M_p +
                 xor_key_path.super_path._M_pathname._M_string_length);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&xor_key_file,
                 (tinyformat *)
                 "The blocksdir XOR-key can not be disabled when a random key was already stored! Stored key: \'%s\', stored path: \'%s\'."
                 ,(char *)&local_138,&local_158,in_R8);
      std::runtime_error::runtime_error(this_01,(string *)&xor_key_file);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00915886;
    }
  }
  ppbVar2 = &xor_key_file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
  xor_key_file.m_file = (FILE *)ppbVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&xor_key_file,in_RDX[4],in_RDX[5] + in_RDX[4]);
  s.m_size = 8;
  s.m_data = xor_key._M_elems;
  HexStr_abi_cxx11_(&local_138,s);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
  ;
  source_file._M_len = 0x65;
  logging_function._M_str = "InitBlocksdirXorKey";
  logging_function._M_len = 0x13;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x498,ALL,Info,(ConstevalFormatString<2U>)0xf7ed50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xor_key_file,
             &local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (xor_key_file.m_file != (FILE *)ppbVar2) {
    operator_delete(xor_key_file.m_file,
                    (ulong)(xor_key_file.m_xor.
                            super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1));
  }
  std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte*,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&this->m_xor_key,xor_key._M_elems,
             (byte *)&local_38,(allocator_type *)&xor_key_file);
  std::filesystem::__cxx11::path::~path(&xor_key_path.super_path);
  p_Var1 = &(this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_prune_locks)._M_h._M_buckets = &(this->m_prune_locks)._M_h._M_single_bucket;
  (this->m_prune_locks)._M_h._M_bucket_count = 1;
  (this->m_prune_locks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prune_locks)._M_h._M_element_count = 0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prune_locks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar5 = in_RDX[1];
  uVar6 = *(undefined8 *)((long)in_RDX + 9);
  uVar7 = *(undefined8 *)((long)in_RDX + 0x11);
  (this->m_opts).chainparams = (CChainParams *)*in_RDX;
  *(undefined8 *)&(this->m_opts).use_xor = uVar5;
  *(undefined8 *)&(this->m_opts).field_0x9 = uVar6;
  *(undefined8 *)((long)&(this->m_opts).prune_target + 1) = uVar7;
  this_00 = &(this->m_opts).blocks_dir;
  std::filesystem::__cxx11::path::path(&this_00->super_path,__p);
  (this->m_opts).notifications = (Notifications *)in_RDX[9];
  std::filesystem::__cxx11::path::path(&local_180,&this_00->super_path);
  dir.super_path._M_pathname._M_string_length = (size_type)__p;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)this_02;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pvVar12;
  dir.super_path._M_pathname.field_2._8_8_ = uVar13;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var14._M_head_impl;
  FlatFileSeq::FlatFileSeq(&this->m_block_file_seq,dir,(char *)&local_180,0xfb263e);
  std::filesystem::__cxx11::path::~path(&local_180);
  std::filesystem::__cxx11::path::path(&local_1a8,&this_00->super_path);
  dir_00.super_path._M_pathname._M_string_length = (size_type)__p;
  dir_00.super_path._M_pathname._M_dataplus._M_p = (pointer)this_02;
  dir_00.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pvVar12;
  dir_00.super_path._M_pathname.field_2._8_8_ = uVar13;
  dir_00.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var14._M_head_impl;
  FlatFileSeq::FlatFileSeq(&this->m_undo_file_seq,dir_00,(char *)&local_1a8,0xfa46da);
  std::filesystem::__cxx11::path::~path(&local_1a8);
  this->m_interrupt = interrupt;
  this->m_importing = (__atomic_base<bool>)0x0;
  this->m_blockfiles_indexed = (__atomic_base<bool>)0x1;
  (this->m_block_index)._M_h._M_buckets = &(this->m_block_index)._M_h._M_single_bucket;
  (this->m_block_index)._M_h._M_bucket_count = 1;
  (this->m_block_index)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_block_index)._M_h._M_element_count = 0;
  (this->m_block_index)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_block_index)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_block_index)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  p_Var1 = &(this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_block_tree_db)._M_t.
  super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>._M_t.
  super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>.
  super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl = (BlockTreeDB *)0x0;
  this->m_have_pruned = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00915886:
  __stack_chk_fail();
}

Assistant:

BlockManager::BlockManager(const util::SignalInterrupt& interrupt, Options opts)
    : m_prune_mode{opts.prune_target > 0},
      m_xor_key{InitBlocksdirXorKey(opts)},
      m_opts{std::move(opts)},
      m_block_file_seq{FlatFileSeq{m_opts.blocks_dir, "blk", m_opts.fast_prune ? 0x4000 /* 16kB */ : BLOCKFILE_CHUNK_SIZE}},
      m_undo_file_seq{FlatFileSeq{m_opts.blocks_dir, "rev", UNDOFILE_CHUNK_SIZE}},
      m_interrupt{interrupt} {}